

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int get_push_size(uchar *bytes,size_t bytes_len,_Bool get_opcode_size,size_t *size_out)

{
  uint16_t uVar1;
  uint32_t uVar2;
  leint32_t data_len_1;
  leint16_t data_len;
  size_t opcode_len;
  size_t *size_out_local;
  _Bool get_opcode_size_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (((bytes == (uchar *)0x0) || (bytes_len == 0)) || (size_out == (size_t *)0x0)) {
    return -2;
  }
  if (*bytes < 0x4c) {
    _data_len_1 = 1;
    *size_out = (ulong)*bytes;
  }
  else if (*bytes == 'L') {
    _data_len_1 = 2;
    if (bytes_len < 2) {
      return -2;
    }
    *size_out = (ulong)bytes[1];
  }
  else if (*bytes == 'M') {
    _data_len_1 = 3;
    if (bytes_len < 3) {
      return -2;
    }
    uVar1 = le16_to_cpu(*(leint16_t *)(bytes + 1));
    *size_out = (ulong)uVar1;
  }
  else {
    if (*bytes != 'N') {
      return -2;
    }
    _data_len_1 = 5;
    if (bytes_len < 5) {
      return -2;
    }
    uVar2 = le32_to_cpu(*(leint32_t *)(bytes + 1));
    *size_out = (ulong)uVar2;
  }
  if (bytes_len < _data_len_1 + *size_out) {
    bytes_local._4_4_ = -2;
  }
  else {
    if (get_opcode_size) {
      *size_out = _data_len_1;
    }
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

static int get_push_size(const unsigned char *bytes, size_t bytes_len,
                         bool get_opcode_size, size_t *size_out)
{
    size_t opcode_len;

    if (!bytes || !bytes_len || !size_out)
        return WALLY_EINVAL;

    if (bytes[0] < 76) {
        opcode_len = 1;
        *size_out = bytes[0];
    } else if (bytes[0] == OP_PUSHDATA1) {
        opcode_len = 2;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        *size_out = bytes[1];
    } else if (bytes[0] == OP_PUSHDATA2) {
        leint16_t data_len;
        opcode_len = 3;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        memcpy(&data_len, &bytes[1], sizeof(data_len));
        *size_out = le16_to_cpu(data_len);
    } else if (bytes[0] == OP_PUSHDATA4) {
        leint32_t data_len;
        opcode_len = 5;
        if (bytes_len < opcode_len)
            return WALLY_EINVAL;
        memcpy(&data_len, &bytes[1], sizeof(data_len));
        *size_out = le32_to_cpu(data_len);
    } else
        return WALLY_EINVAL; /* Not a push */
    if (bytes_len < opcode_len + *size_out)
        return WALLY_EINVAL; /* Push is longer than current script bytes */
    if (get_opcode_size)
        *size_out = opcode_len;
    return WALLY_OK;
}